

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O2

Qiniu_Error
Qiniu_RS_BatchStat(Qiniu_Client *self,Qiniu_RS_BatchStatRet *rets,Qiniu_RS_EntryPath *entries,
                  Qiniu_ItemCount entryCount)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *s2;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar4;
  Qiniu_Int64 QVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  char *__s;
  Qiniu_Error QVar9;
  Qiniu_Error QVar10;
  char *rsHost;
  cJSON *root;
  char *local_40;
  cJSON *local_38;
  
  uVar8 = 0;
  QVar9 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_40);
  if (QVar9.code == 200) {
    pcVar2 = Qiniu_String_Concat2(local_40,"/batch");
    uVar7 = (ulong)(uint)entryCount;
    if (entryCount < 1) {
      uVar7 = uVar8;
    }
    __s = (char *)0x0;
    for (; uVar7 << 4 != uVar8; uVar8 = uVar8 + 0x10) {
      pcVar3 = Qiniu_String_Concat3
                         (*(char **)((long)&entries->bucket + uVar8),":",
                          *(char **)((long)&entries->key + uVar8));
      s2 = Qiniu_String_Encode(pcVar3);
      s3 = Qiniu_String_Concat2("op=/stat/",s2);
      free(pcVar3);
      free(s2);
      pcVar3 = s3;
      if (__s != (char *)0x0) {
        pcVar3 = Qiniu_String_Concat3(__s,"&",s3);
        free(s3);
      }
      free(__s);
      __s = pcVar3;
    }
    bodyLen = strlen(__s);
    QVar10 = Qiniu_Client_CallWithBuffer
                       (self,&local_38,pcVar2,__s,bodyLen,"application/x-www-form-urlencoded");
    free(pcVar2);
    free(__s);
    uVar1 = cJSON_GetArraySize(local_38);
    uVar7 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar7;
    }
    piVar6 = &rets->code;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pcVar4 = cJSON_GetArrayItem(local_38,(int)uVar7);
      QVar5 = Qiniu_Json_GetInt64(pcVar4,"code",0);
      pcVar4 = cJSON_GetObjectItem(pcVar4,"data");
      *piVar6 = (int)QVar5;
      if ((int)QVar5 == 200) {
        pcVar2 = Qiniu_Json_GetString(pcVar4,"hash",(char *)0x0);
        (((Qiniu_RS_BatchStatRet *)(piVar6 + -0xc))->data).hash = pcVar2;
        pcVar2 = Qiniu_Json_GetString(pcVar4,"mimeType",(char *)0x0);
        *(char **)(piVar6 + -10) = pcVar2;
        QVar5 = Qiniu_Json_GetInt64(pcVar4,"fsize",0);
        *(Qiniu_Int64 *)(piVar6 + -8) = QVar5;
        QVar5 = Qiniu_Json_GetInt64(pcVar4,"putTime",0);
        *(Qiniu_Int64 *)(piVar6 + -6) = QVar5;
        QVar5 = Qiniu_Json_GetInt64(pcVar4,"type",0);
        *(Qiniu_Int64 *)(piVar6 + -4) = QVar5;
      }
      else {
        pcVar2 = Qiniu_Json_GetString(pcVar4,"error",(char *)0x0);
        *(char **)(piVar6 + -2) = pcVar2;
      }
      piVar6 = piVar6 + 0xe;
    }
    QVar9._4_4_ = 0;
    QVar9.code = QVar10.code;
    QVar9.message = QVar10.message;
  }
  return QVar9;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchStat(
    Qiniu_Client *self, Qiniu_RS_BatchStatRet *rets,
    Qiniu_RS_EntryPath *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *opBody;
    Qiniu_RS_EntryPath *entry = entries;
    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);
        opBody = Qiniu_String_Concat2("op=/stat/", entryURIEncoded);
        free(entryURI);
        free(entryURIEncoded);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        else
        {
            rets[curr].data.hash = Qiniu_Json_GetString(dataItem, "hash", 0);
            rets[curr].data.mimeType = Qiniu_Json_GetString(dataItem, "mimeType", 0);
            rets[curr].data.fsize = Qiniu_Json_GetInt64(dataItem, "fsize", 0);
            rets[curr].data.putTime = Qiniu_Json_GetInt64(dataItem, "putTime", 0);
            rets[curr].data.type = Qiniu_Json_GetInt64(dataItem, "type", 0);
        }
        curr++;
    }

    return err;
}